

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O0

int lookup1_values(int entries,int dim)

{
  int in_ESI;
  int in_EDI;
  undefined8 in_XMM0_Qa;
  double dVar1;
  __type _Var2;
  int r;
  undefined4 local_10;
  undefined4 local_4;
  
  dVar1 = std::log((double)CONCAT44((int)((ulong)in_XMM0_Qa >> 0x20),(float)in_EDI));
  dVar1 = std::exp((double)CONCAT44((int)((ulong)dVar1 >> 0x20),SUB84(dVar1,0) / (float)in_ESI));
  dVar1 = std::floor(dVar1);
  local_10 = (int)SUB84(dVar1,0);
  _Var2 = std::pow<float,int>(0.0,0x248c5e);
  dVar1 = floor(_Var2);
  if ((int)dVar1 <= in_EDI) {
    local_10 = local_10 + 1;
  }
  _Var2 = std::pow<float,int>(0.0,0x248c93);
  if ((double)in_EDI < _Var2) {
    _Var2 = std::pow<float,int>(0.0,0x248cbb);
    dVar1 = floor(_Var2);
    if (in_EDI < (int)dVar1) {
      local_4 = -1;
    }
    else {
      local_4 = local_10;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int lookup1_values(int entries, int dim)
{
   int r = (int) floor(exp((float) log((float) entries) / dim));
   if ((int) floor(pow((float) r+1, dim)) <= entries)   // (int) cast for MinGW warning;
      ++r;                                              // floor() to avoid _ftol() when non-CRT
   if (pow((float) r+1, dim) <= entries)
      return -1;
   if ((int) floor(pow((float) r, dim)) > entries)
      return -1;
   return r;
}